

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files_test.c
# Opt level: O3

void test_directory_walk(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  undefined1 auStack_78 [8];
  scratch s;
  
  s.b = (char *)0x0;
  s.c = (char *)0x0;
  s.mydir = (char *)0x0;
  s.a = (char *)0x0;
  auStack_78 = (undefined1  [8])0x0;
  s.temp = (char *)0x0;
  make_scratch((scratch *)auStack_78);
  pcVar4 = s.temp;
  s.d = (char *)0x0;
  nVar1 = nni_file_walk(s.temp,walker,&s.d,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                         ,0xc4,"%s: expected success, got %s (%d)",
                         "nni_file_walk(s.mydir, walker, &wa, 0)",pcVar3,nVar1);
  if (iVar2 != 0) {
    acutest_check_((uint)((int)s.d == 1),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                   ,0xc5,"%s","wa.a == 1");
    acutest_check_((uint)(s.d._4_4_ == 1),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                   ,0xc6,"%s","wa.b == 1");
    acutest_check_(0,
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                   ,199,"%s","wa.c == 1");
    acutest_check_(0,
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                   ,200,"%s","wa.d == 1");
    acutest_check_(0,
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                   ,0xc9,"%s","wa.seen == 4");
    s.d = (char *)0x0;
    nVar1 = nni_file_walk(pcVar4,walker,&s.d,4);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                           ,0xcd,"%s: expected success, got %s (%d)",
                           "nni_file_walk(s.mydir, walker, &wa, NNI_FILE_WALK_FILES_ONLY)",pcVar3,
                           nVar1);
    if (iVar2 != 0) {
      acutest_check_((uint)((int)s.d == 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                     ,0xce,"%s","wa.a == 1");
      acutest_check_((uint)(s.d._4_4_ == 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                     ,0xcf,"%s","wa.b == 1");
      acutest_check_(1,
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                     ,0xd0,"%s","wa.c == 0");
      acutest_check_(0,
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                     ,0xd1,"%s","wa.d == 1");
      acutest_check_(0,
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                     ,0xd2,"%s","wa.seen == 3");
      s.d = (char *)0x0;
      nVar1 = nni_file_walk(pcVar4,walker,&s.d,2);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                             ,0xd5,"%s: expected success, got %s (%d)",
                             "nni_file_walk(s.mydir, walker, &wa, NNI_FILE_WALK_SHALLOW)",pcVar3,
                             nVar1);
      if (iVar2 != 0) {
        acutest_check_((uint)((int)s.d == 1),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                       ,0xd6,"%s","wa.a == 1");
        acutest_check_((uint)(s.d._4_4_ == 1),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                       ,0xd7,"%s","wa.b == 1");
        acutest_check_(0,
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                       ,0xd8,"%s","wa.c == 1");
        acutest_check_(1,
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                       ,0xd9,"%s","wa.d == 0");
        acutest_check_(0,
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                       ,0xda,"%s","wa.seen == 3");
        s.d = (char *)0x0;
        nVar1 = nni_file_walk(pcVar4,walker,&s.d,6);
        pcVar4 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                               ,0xde,"%s: expected success, got %s (%d)",
                               "nni_file_walk(s.mydir, walker, &wa, NNI_FILE_WALK_SHALLOW | NNI_FILE_WALK_FILES_ONLY)"
                               ,pcVar4,nVar1);
        if (iVar2 != 0) {
          acutest_check_((uint)((int)s.d == 1),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                         ,0xdf,"%s","wa.a == 1");
          acutest_check_((uint)(s.d._4_4_ == 1),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                         ,0xe0,"%s","wa.b == 1");
          acutest_check_(1,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                         ,0xe1,"%s","wa.c == 0");
          acutest_check_(1,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                         ,0xe2,"%s","wa.d == 0");
          acutest_check_(0,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/files_test.c"
                         ,0xe3,"%s","wa.seen == 2");
          clean_scratch((scratch *)auStack_78);
          return;
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_directory_walk(void)
{
	struct scratch s  = { 0 };
	struct walkarg wa = { 0 };

	make_scratch(&s);
	memset(&wa, 0, sizeof(wa));
	NUTS_PASS(nni_file_walk(s.mydir, walker, &wa, 0));
	NUTS_TRUE(wa.a == 1);
	NUTS_TRUE(wa.b == 1);
	NUTS_TRUE(wa.c == 1);
	NUTS_TRUE(wa.d == 1);
	NUTS_TRUE(wa.seen == 4);

	memset(&wa, 0, sizeof(wa));
	NUTS_PASS(
	    nni_file_walk(s.mydir, walker, &wa, NNI_FILE_WALK_FILES_ONLY));
	NUTS_TRUE(wa.a == 1);
	NUTS_TRUE(wa.b == 1);
	NUTS_TRUE(wa.c == 0);
	NUTS_TRUE(wa.d == 1);
	NUTS_TRUE(wa.seen == 3);

	memset(&wa, 0, sizeof(wa));
	NUTS_PASS(nni_file_walk(s.mydir, walker, &wa, NNI_FILE_WALK_SHALLOW));
	NUTS_TRUE(wa.a == 1);
	NUTS_TRUE(wa.b == 1);
	NUTS_TRUE(wa.c == 1);
	NUTS_TRUE(wa.d == 0);
	NUTS_TRUE(wa.seen == 3);

	memset(&wa, 0, sizeof(wa));
	NUTS_PASS(nni_file_walk(s.mydir, walker, &wa,
	    NNI_FILE_WALK_SHALLOW | NNI_FILE_WALK_FILES_ONLY));
	NUTS_TRUE(wa.a == 1);
	NUTS_TRUE(wa.b == 1);
	NUTS_TRUE(wa.c == 0);
	NUTS_TRUE(wa.d == 0);
	NUTS_TRUE(wa.seen == 2);

	clean_scratch(&s);
}